

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_intpl.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *__s;
  string *input_stream;
  bool bVar5;
  int vector_length;
  double magic_number;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> data;
  ifstream ifs;
  InputSourceFillingMagicNumber input_source_filling_magic_number;
  InputSourceFromStream input_source;
  option long_options [2];
  int local_4fc;
  string local_4f8;
  double local_4d8;
  string local_4d0 [3];
  ios_base local_460 [264];
  vector<double,_std::allocator<double>_> local_358;
  string local_340;
  byte abStack_320 [80];
  ios_base local_2d0 [408];
  InputSourceFillingMagicNumber local_138;
  InputSourceFromStream local_98;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_4fc = 1;
  local_4d8 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  do {
    while( true ) {
      iVar3 = ya_getopt_long_only(argc,argv,"l:m:h",&local_78,(int *)0x0);
      if (iVar3 < 0x6d) break;
      if (iVar3 == 0x6d) {
        std::__cxx11::string::string((string *)&local_340,ya_optarg,(allocator *)local_4d0);
        bVar1 = sptk::ConvertStringToInteger(&local_340,&local_4fc);
        bVar5 = local_4fc < 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p);
        }
        if (!bVar1 || bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_340,"The argument for the -m option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_340,"non-negative integer",0x14);
          local_4d0[0]._M_dataplus._M_p = (pointer)&local_4d0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"magic_intpl","");
          sptk::PrintErrorMessage(local_4d0,(ostringstream *)&local_340);
          goto LAB_00103bf1;
        }
        local_4fc = local_4fc + 1;
      }
      else {
        if (iVar3 != 1000) {
LAB_00103985:
          anon_unknown.dwarf_3007::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        std::__cxx11::string::string((string *)&local_340,ya_optarg,(allocator *)local_4d0);
        bVar1 = sptk::ConvertStringToDouble(&local_340,&local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p);
        }
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_340,"The argument for the -magic option must be a number",
                     0x33);
          local_4d0[0]._M_dataplus._M_p = (pointer)&local_4d0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"magic_intpl","");
          sptk::PrintErrorMessage(local_4d0,(ostringstream *)&local_340);
          goto LAB_00103bf1;
        }
      }
    }
    if (iVar3 != 0x6c) {
      if (iVar3 != -1) {
        if (iVar3 == 0x68) {
          anon_unknown.dwarf_3007::PrintUsage((ostream *)&std::cout);
          return 0;
        }
        goto LAB_00103985;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_340,"Too many input files",0x14);
        local_4d0[0]._M_dataplus._M_p = (pointer)&local_4d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"magic_intpl","");
        sptk::PrintErrorMessage(local_4d0,(ostringstream *)&local_340);
        goto LAB_00103bf1;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_340,"Cannot set translation mode",0x1b);
        local_4d0[0]._M_dataplus._M_p = (pointer)&local_4d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"magic_intpl","");
        sptk::PrintErrorMessage(local_4d0,(ostringstream *)&local_340);
        goto LAB_00103bf1;
      }
      input_stream = &local_340;
      std::ifstream::ifstream(input_stream);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_340,(_Ios_Openmode)__s),
         (abStack_320[*(long *)(local_340._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          input_stream = (string *)&std::cin;
        }
        sptk::InputSourceFromStream::InputSourceFromStream
                  (&local_98,false,local_4fc,(istream *)input_stream);
        if (local_98.is_valid_ != false) {
          sptk::InputSourceFillingMagicNumber::InputSourceFillingMagicNumber
                    (&local_138,local_4d8,&local_98.super_InputSourceInterface);
          if (local_138.is_valid_ != false) {
            local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            break;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d0,"Failed to initialize InputSourceFillingMagicNumber",0x32)
          ;
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"magic_intpl","");
          sptk::PrintErrorMessage(&local_4f8,(ostringstream *)local_4d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
          std::ios_base::~ios_base(local_460);
          iVar3 = 1;
          goto LAB_00103ea1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4d0,"Failed to initialize InputSourceFromStream",0x2a);
        local_138.super_InputSourceInterface._vptr_InputSourceInterface =
             (_func_int **)&local_138.source_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"magic_intpl","");
        sptk::PrintErrorMessage((string *)&local_138,(ostringstream *)local_4d0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4d0,"Cannot open file ",0x11);
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,__s,sVar4);
        local_138.super_InputSourceInterface._vptr_InputSourceInterface =
             (_func_int **)&local_138.source_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"magic_intpl","");
        sptk::PrintErrorMessage((string *)&local_138,(ostringstream *)local_4d0);
      }
      if ((InputSourceInterface **)local_138.super_InputSourceInterface._vptr_InputSourceInterface
          != &local_138.source_) {
        operator_delete(local_138.super_InputSourceInterface._vptr_InputSourceInterface);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
      std::ios_base::~ios_base(local_460);
      iVar3 = 1;
      goto LAB_00103eae;
    }
    std::__cxx11::string::string((string *)&local_340,ya_optarg,(allocator *)local_4d0);
    bVar5 = sptk::ConvertStringToInteger(&local_340,&local_4fc);
    bVar1 = local_4fc < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    if (!bVar5 || bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_340,"The argument for the -l option must be a positive integer",
                 0x39);
      local_4d0[0]._M_dataplus._M_p = (pointer)&local_4d0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"magic_intpl","");
      sptk::PrintErrorMessage(local_4d0,(ostringstream *)&local_340);
LAB_00103bf1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0[0]._M_dataplus._M_p != &local_4d0[0].field_2) {
        operator_delete(local_4d0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_340);
      std::ios_base::~ios_base(local_2d0);
      return 1;
    }
  } while( true );
  while (bVar1 = sptk::WriteStream<double>(0,local_4fc,&local_358,(ostream *)&std::cout,(int *)0x0),
        bVar1) {
    bVar1 = sptk::InputSourceFillingMagicNumber::Get(&local_138,&local_358);
    if (!bVar1) {
      iVar3 = 0;
      goto LAB_00103e8f;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4d0,"Failed to write interpolated data",0x21);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"magic_intpl","");
  sptk::PrintErrorMessage(&local_4f8,(ostringstream *)local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
  std::ios_base::~ios_base(local_460);
  iVar3 = 1;
LAB_00103e8f:
  if (local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00103ea1:
  sptk::InputSourceFillingMagicNumber::~InputSourceFillingMagicNumber(&local_138);
LAB_00103eae:
  std::ifstream::~ifstream(&local_340);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  double magic_number(kDefaultMagicNumber);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("magic_intpl", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source(false, vector_length, &input_stream);
  if (!input_source.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  sptk::InputSourceFillingMagicNumber input_source_filling_magic_number(
      magic_number, &input_source);
  if (!input_source_filling_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFillingMagicNumber";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  std::vector<double> data;
  try {
    while (input_source_filling_magic_number.Get(&data)) {
      if (!sptk::WriteStream(0, vector_length, data, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write interpolated data";
        sptk::PrintErrorMessage("magic_intpl", error_message);
        return 1;
      }
    }
  } catch (...) {
    std::ostringstream error_message;
    error_message << "Cannot interpolate data";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  return 0;
}